

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractlistview.hpp
# Opt level: O1

void __thiscall
QtMWidgets::AbstractListView<QColor>::rowsRemoved(AbstractListView<QColor> *this,int first,int last)

{
  AbstractScrollAreaPrivate *pAVar1;
  AbstractScrollArea *this_00;
  int iVar2;
  Spec SVar3;
  QRect QVar4;
  
  pAVar1 = (this->super_AbstractListViewBase).super_AbstractScrollArea.d.d;
  SVar3 = pAVar1[1].indicatorColor.cspec;
  if ((int)SVar3 <= last && first <= (int)SVar3) {
    SVar3 = ~Invalid;
    if (pAVar1[1].q != (AbstractScrollArea *)0x0) {
      iVar2 = (**(code **)(*(long *)pAVar1[1].q + 0x80))();
      if (iVar2 != 0) {
        SVar3 = first - Rgb;
        if (first < 1) {
          SVar3 = last + Rgb;
        }
      }
    }
    pAVar1[1].indicatorColor.cspec = SVar3;
    *(undefined4 *)&pAVar1[1].indicatorColor.ct = 0;
  }
  (**(code **)(*(long *)&(this->super_AbstractListViewBase).super_AbstractScrollArea + 0x1b8))(this)
  ;
  if (first <= last) {
    this_00 = pAVar1->q;
    do {
      QVar4 = visualRect((AbstractListView<QColor> *)this_00,first);
      if ((QVar4.x1 + -1 != QVar4.x2) || (QVar4.y1 + -1 != QVar4.y2)) {
        QWidget::update();
        return;
      }
      first = first + 1;
    } while (last + 1 != first);
  }
  return;
}

Assistant:

void rowsRemoved( int first, int last ) override
	{
		AbstractListViewPrivate< T > * d = d_func();

		if( d->firstVisibleRow >= first && d->firstVisibleRow <= last )
		{
			if( d->model && d->model->rowCount() )
			{
				if( first - 1 >= 0 )
					d->firstVisibleRow = first - 1;
				else
					d->firstVisibleRow = last + 1;

				d->offset = 0;
			}
			else
			{
				d->firstVisibleRow = -1;
				d->offset = 0;
			}
		}

		recalculateSize();

		d->updateIfNeeded( first, last )	;
	}